

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

bool GUIComponentSave(string *path,vector<GUIComponent,_std::allocator<GUIComponent>_> *components)

{
  byte bVar1;
  bool bVar2;
  reference pGVar3;
  ostream *poVar4;
  GUIComponent *component;
  const_iterator __end1;
  const_iterator __begin1;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *__range1;
  ostream local_220 [8];
  ofstream file;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *components_local;
  string *path_local;
  
  std::ofstream::ofstream(local_220,path,0x10);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    path_local._7_1_ = false;
  }
  else {
    __end1 = std::vector<GUIComponent,_std::allocator<GUIComponent>_>::begin(components);
    component = (GUIComponent *)
                std::vector<GUIComponent,_std::allocator<GUIComponent>_>::end(components);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
                                       *)&component), bVar2) {
      pGVar3 = __gnu_cxx::
               __normal_iterator<const_GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
               ::operator*(&__end1);
      switch(pGVar3->Type) {
      case EGUIComponentTypeSlider1:
        poVar4 = std::operator<<(local_220,(string *)&pGVar3->UniformName);
        std::operator<<(poVar4," s1 ");
        std::ostream::operator<<(local_220,pGVar3->Data[0]);
        std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
        break;
      case EGUIComponentTypeSlider2:
        poVar4 = std::operator<<(local_220,(string *)&pGVar3->UniformName);
        std::operator<<(poVar4," s2 ");
        poVar4 = (ostream *)std::ostream::operator<<(local_220,pGVar3->Data[0]);
        std::operator<<(poVar4," ");
        std::ostream::operator<<(local_220,pGVar3->Data[1]);
        std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
        break;
      case EGUIComponentTypeSlider3:
        poVar4 = std::operator<<(local_220,(string *)&pGVar3->UniformName);
        std::operator<<(poVar4," s3 ");
        poVar4 = (ostream *)std::ostream::operator<<(local_220,pGVar3->Data[0]);
        std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(local_220,pGVar3->Data[1]);
        std::operator<<(poVar4," ");
        std::ostream::operator<<(local_220,pGVar3->Data[2]);
        std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
        break;
      case EGUIComponentTypeSlider4:
        poVar4 = std::operator<<(local_220,(string *)&pGVar3->UniformName);
        std::operator<<(poVar4," s4 ");
        poVar4 = (ostream *)std::ostream::operator<<(local_220,pGVar3->Data[0]);
        std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(local_220,pGVar3->Data[1]);
        std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(local_220,pGVar3->Data[2]);
        std::operator<<(poVar4," ");
        std::ostream::operator<<(local_220,pGVar3->Data[3]);
        std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
        break;
      case EGUIComponentTypeColor3:
        poVar4 = std::operator<<(local_220,(string *)&pGVar3->UniformName);
        std::operator<<(poVar4," c3 ");
        poVar4 = (ostream *)std::ostream::operator<<(local_220,pGVar3->Data[0]);
        std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(local_220,pGVar3->Data[1]);
        std::operator<<(poVar4," ");
        std::ostream::operator<<(local_220,pGVar3->Data[2]);
        std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
        break;
      case EGUIComponentTypeColor4:
        poVar4 = std::operator<<(local_220,(string *)&pGVar3->UniformName);
        std::operator<<(poVar4," c4 ");
        poVar4 = (ostream *)std::ostream::operator<<(local_220,pGVar3->Data[0]);
        std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(local_220,pGVar3->Data[1]);
        std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(local_220,pGVar3->Data[2]);
        std::operator<<(poVar4," ");
        std::ostream::operator<<(local_220,pGVar3->Data[3]);
        std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
      }
      __gnu_cxx::
      __normal_iterator<const_GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
      ::operator++(&__end1);
    }
    std::ofstream::close();
    path_local._7_1_ = true;
  }
  std::ofstream::~ofstream(local_220);
  return path_local._7_1_;
}

Assistant:

bool GUIComponentSave(const std::string& path, const std::vector<GUIComponent>& components) {
    std::ofstream file(path);
    
    if (!file.is_open()) {
        return false;
    }
    
    for (const GUIComponent& component : components) {
        switch (component.Type) {
            case EGUIComponentTypeSlider1:
                file << component.UniformName << " s1 ";
                file << component.Data[0];
                file << std::endl;
                break;
            case EGUIComponentTypeSlider2:
                file << component.UniformName << " s2 ";
                file << component.Data[0] << " ";
                file << component.Data[1];
                file << std::endl;
                break;
            case EGUIComponentTypeSlider3:
                file << component.UniformName << " s3 ";
                file << component.Data[0] << " ";
                file << component.Data[1] << " ";
                file << component.Data[2];
                file << std::endl;
                break;
            case EGUIComponentTypeSlider4:
                file << component.UniformName << " s4 ";
                file << component.Data[0] << " ";
                file << component.Data[1] << " ";
                file << component.Data[2] << " ";
                file << component.Data[3];
                file << std::endl;
                break;
            case EGUIComponentTypeColor3:
                file << component.UniformName << " c3 ";
                file << component.Data[0] << " ";
                file << component.Data[1] << " ";
                file << component.Data[2];
                file << std::endl;
                break;
            case EGUIComponentTypeColor4:
                file << component.UniformName << " c4 ";
                file << component.Data[0] << " ";
                file << component.Data[1] << " ";
                file << component.Data[2] << " ";
                file << component.Data[3];
                file << std::endl;
                break;
        }
    }
    
    file.close();
    return true;
}